

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

void __thiscall
TCMallocImplementation::Ranges(TCMallocImplementation *this,void *arg,RangeFunction *func)

{
  RangeFunction *func_local;
  void *arg_local;
  TCMallocImplementation *this_local;
  
  IterateOverRanges(arg,func);
  return;
}

Assistant:

virtual void Ranges(void* arg, RangeFunction func) {
    IterateOverRanges(arg, func);
  }